

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Vgm_File::track_info_(Vgm_File *this,track_info_t *out,int param_3)

{
  size_t sVar1;
  uchar *end;
  undefined4 in_EDX;
  header_t *in_RSI;
  byte_ *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  get_vgm_length(in_RSI,(track_info_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  sVar1 = blargg_vector<unsigned_char>::size((blargg_vector<unsigned_char> *)(in_RDI + 0x1e0));
  if (sVar1 != 0) {
    end = blargg_vector<unsigned_char>::begin((blargg_vector<unsigned_char> *)(in_RDI + 0x1e0));
    blargg_vector<unsigned_char>::end((blargg_vector<unsigned_char> *)(in_RDI + 0x1e0));
    parse_gd3(in_RDI,end,(track_info_t *)0x80c6eb);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t track_info_( track_info_t* out, int ) const
	{
		get_vgm_length( h, out );
		if ( gd3.size() )
			parse_gd3( gd3.begin(), gd3.end(), out );
		return 0;
	}